

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void hash_init(hash *hash,int nbuckets,hash_hash_func *hash_func,hash_cmp_func *cmp_func)

{
  void *pvVar1;
  ulong in_RCX;
  ulong in_RDX;
  int in_ESI;
  ulong *in_RDI;
  size_t i;
  ulong local_28;
  
  *in_RDI = (long)in_ESI;
  pvVar1 = malloc(*in_RDI << 4);
  in_RDI[1] = (ulong)pvVar1;
  for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
    avl_init((avl_tree *)(in_RDI[1] + local_28 * 0x10),in_RDI);
  }
  in_RDI[2] = in_RDX;
  in_RDI[3] = in_RCX;
  return;
}

Assistant:

void hash_init(struct hash *hash, int nbuckets, hash_hash_func *hash_func, hash_cmp_func *cmp_func)
{
    size_t i;
    hash->nbuckets = nbuckets;
#ifdef _HASH_TREE
    hash->buckets = (struct avl_tree *)malloc(sizeof(struct avl_tree) * hash->nbuckets);
#else
    hash->buckets = (struct list *)malloc(sizeof(struct list) * hash->nbuckets);
#endif

    IFDEF_LOCK( hash->locks = (spin_t*)malloc(sizeof(spin_t) * hash->nbuckets) );

    for (i=0;i<hash->nbuckets;++i){
#ifdef _HASH_TREE
        avl_init(hash->buckets + i, (void *)hash);
#else
        list_init(hash->buckets + i);
#endif

        IFDEF_LOCK( spin_init(hash->locks + i); );
    }

    hash->hash_func = hash_func;
    hash->cmp = cmp_func;
}